

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeMakeReady(Vdbe *p,Parse *pParse)

{
  long lVar1;
  long lVar2;
  Vdbe *pVVar3;
  void *pvVar4;
  bool bVar5;
  bool local_4d;
  int local_4c;
  Op *pOStack_48;
  int nByte;
  u8 *zEnd;
  u8 *zCsr;
  int n;
  int nOnce;
  int nArg;
  int nCursor;
  int nMem;
  int nVar;
  sqlite3 *db;
  Parse *pParse_local;
  Vdbe *p_local;
  
  _nMem = p->db;
  nCursor = pParse->nVar;
  nOnce = pParse->nTab;
  n = pParse->nMaxArg;
  zCsr._4_4_ = pParse->nOnce;
  if (zCsr._4_4_ == 0) {
    zCsr._4_4_ = 1;
  }
  nArg = nOnce + pParse->nMem;
  zEnd = &p->aOp[p->nOp].opcode;
  pOStack_48 = p->aOp + p->nOpAlloc;
  db = (sqlite3 *)pParse;
  pParse_local = (Parse *)p;
  resolveP2Values(p,&n);
  local_4d = false;
  if (*(char *)((long)&db->aDb + 3) != '\0') {
    local_4d = *(char *)((long)&db->aDb + 4) != '\0';
  }
  *(ushort *)((long)&pParse_local->aColCache[1].iReg + 2) =
       *(ushort *)((long)&pParse_local->aColCache[1].iReg + 2) & 0xff7f | (ushort)local_4d << 7;
  if ((*(char *)((long)(db->aFunc).a + 0x24) != '\0') && (nArg < 10)) {
    nArg = 10;
  }
  memset(zEnd,0,(long)pOStack_48 - (long)zEnd);
  zEnd = zEnd + ((ulong)zEnd & 7);
  *(ushort *)((long)&pParse_local->aColCache[1].iReg + 2) =
       *(ushort *)((long)&pParse_local->aColCache[1].iReg + 2) & 0xffdf;
  do {
    local_4c = 0;
    pVVar3 = (Vdbe *)allocSpace(pParse_local->pVdbe,nArg * 0x38,&zEnd,&pOStack_48->opcode,&local_4c)
    ;
    pParse_local->pVdbe = pVVar3;
    pvVar4 = allocSpace(*(void **)&pParse_local->aColCache[0].tempReg,nCursor * 0x38,&zEnd,
                        &pOStack_48->opcode,&local_4c);
    *(void **)&pParse_local->aColCache[0].tempReg = pvVar4;
    pvVar4 = allocSpace(*(void **)&pParse_local->rc,n << 3,&zEnd,&pOStack_48->opcode,&local_4c);
    *(void **)&pParse_local->rc = pvVar4;
    pvVar4 = allocSpace(*(void **)&pParse_local->aColCache[0].iReg,nCursor << 3,&zEnd,
                        &pOStack_48->opcode,&local_4c);
    *(void **)&pParse_local->aColCache[0].iReg = pvVar4;
    pvVar4 = allocSpace(*(void **)pParse_local->aColCache,nOnce << 3,&zEnd,&pOStack_48->opcode,
                        &local_4c);
    *(void **)pParse_local->aColCache = pvVar4;
    pvVar4 = allocSpace(*(void **)&pParse_local->aColCache[6].tempReg,zCsr._4_4_,&zEnd,
                        &pOStack_48->opcode,&local_4c);
    *(void **)&pParse_local->aColCache[6].tempReg = pvVar4;
    if (local_4c != 0) {
      pvVar4 = sqlite3DbMallocZero(_nMem,local_4c);
      *(void **)&pParse_local->aColCache[4].tempReg = pvVar4;
    }
    zEnd = *(u8 **)&pParse_local->aColCache[4].tempReg;
    pOStack_48 = (Op *)(zEnd + local_4c);
    bVar5 = false;
    if (local_4c != 0) {
      bVar5 = _nMem->mallocFailed == '\0';
    }
  } while (bVar5);
  pParse_local->iRangeReg = nOnce;
  pParse_local->aColCache[6].iTable = zCsr._4_4_;
  lVar1._0_1_ = pParse_local->aColCache[0].tempReg;
  lVar1._1_3_ = *(undefined3 *)&pParse_local->aColCache[0].field_0x9;
  lVar1._4_4_ = pParse_local->aColCache[0].iLevel;
  if (lVar1 != 0) {
    *(short *)&pParse_local->aColCache[1].iTable = (short)nCursor;
    for (zCsr._0_4_ = 0; (int)zCsr < nCursor; zCsr._0_4_ = (int)zCsr + 1) {
      *(undefined2 *)(*(long *)&pParse_local->aColCache[0].tempReg + (long)(int)zCsr * 0x38 + 0x24)
           = 1;
      *(sqlite3 **)(*(long *)&pParse_local->aColCache[0].tempReg + (long)(int)zCsr * 0x38) = _nMem;
    }
  }
  lVar2._0_4_ = pParse_local->aColCache[0].iReg;
  lVar2._4_4_ = pParse_local->aColCache[0].lru;
  if (lVar2 != 0) {
    *(short *)((long)&pParse_local->aColCache[1].iTable + 2) =
         (short)*(undefined4 *)((db->aFunc).a + 4);
    memcpy(*(void **)&pParse_local->aColCache[0].iReg,(db->aFunc).a[8],
           (long)*(short *)((long)&pParse_local->aColCache[1].iTable + 2) << 3);
    memset((db->aFunc).a[8],0,(long)*(int *)((db->aFunc).a + 4) << 3);
  }
  if (pParse_local->pVdbe != (Vdbe *)0x0) {
    pParse_local->pVdbe = (Vdbe *)&pParse_local->pVdbe[-1].pFree;
    pParse_local->aTempReg[2] = nArg;
    for (zCsr._0_4_ = 1; (int)zCsr <= nArg; zCsr._0_4_ = (int)zCsr + 1) {
      *(undefined2 *)((long)&pParse_local->pVdbe->aColName + (long)(int)zCsr * 0x38 + 4) = 0x80;
      (&pParse_local->pVdbe->db)[(long)(int)zCsr * 7] = _nMem;
    }
  }
  *(ushort *)((long)&pParse_local->aColCache[1].iReg + 2) =
       *(ushort *)((long)&pParse_local->aColCache[1].iReg + 2) & 0xfffc |
       *(byte *)((long)(db->aFunc).a + 0x24) & 3;
  sqlite3VdbeRewind((Vdbe *)pParse_local);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMakeReady(
  Vdbe *p,                       /* The VDBE */
  Parse *pParse                  /* Parsing context */
){
  sqlite3 *db;                   /* The database connection */
  int nVar;                      /* Number of parameters */
  int nMem;                      /* Number of VM memory registers */
  int nCursor;                   /* Number of cursors required */
  int nArg;                      /* Number of arguments in subprograms */
  int nOnce;                     /* Number of OP_Once instructions */
  int n;                         /* Loop counter */
  u8 *zCsr;                      /* Memory available for allocation */
  u8 *zEnd;                      /* First byte past allocated memory */
  int nByte;                     /* How much extra memory is needed */

  assert( p!=0 );
  assert( p->nOp>0 );
  assert( pParse!=0 );
  assert( p->magic==VDBE_MAGIC_INIT );
  db = p->db;
  assert( db->mallocFailed==0 );
  nVar = pParse->nVar;
  nMem = pParse->nMem;
  nCursor = pParse->nTab;
  nArg = pParse->nMaxArg;
  nOnce = pParse->nOnce;
  if( nOnce==0 ) nOnce = 1; /* Ensure at least one byte in p->aOnceFlag[] */
  
  /* For each cursor required, also allocate a memory cell. Memory
  ** cells (nMem+1-nCursor)..nMem, inclusive, will never be used by
  ** the vdbe program. Instead they are used to allocate space for
  ** VdbeCursor/BtCursor structures. The blob of memory associated with 
  ** cursor 0 is stored in memory cell nMem. Memory cell (nMem-1)
  ** stores the blob of memory associated with cursor 1, etc.
  **
  ** See also: allocateCursor().
  */
  nMem += nCursor;

  /* Allocate space for memory registers, SQL variables, VDBE cursors and 
  ** an array to marshal SQL function arguments in.
  */
  zCsr = (u8*)&p->aOp[p->nOp];       /* Memory avaliable for allocation */
  zEnd = (u8*)&p->aOp[p->nOpAlloc];  /* First byte past end of zCsr[] */

  resolveP2Values(p, &nArg);
  p->usesStmtJournal = (u8)(pParse->isMultiWrite && pParse->mayAbort);
  if( pParse->explain && nMem<10 ){
    nMem = 10;
  }
  memset(zCsr, 0, zEnd-zCsr);
  zCsr += (zCsr - (u8*)0)&7;
  assert( EIGHT_BYTE_ALIGNMENT(zCsr) );
  p->expired = 0;

  /* Memory for registers, parameters, cursor, etc, is allocated in two
  ** passes.  On the first pass, we try to reuse unused space at the 
  ** end of the opcode array.  If we are unable to satisfy all memory
  ** requirements by reusing the opcode array tail, then the second
  ** pass will fill in the rest using a fresh allocation.  
  **
  ** This two-pass approach that reuses as much memory as possible from
  ** the leftover space at the end of the opcode array can significantly
  ** reduce the amount of memory held by a prepared statement.
  */
  do {
    nByte = 0;
    p->aMem = allocSpace(p->aMem, nMem*sizeof(Mem), &zCsr, zEnd, &nByte);
    p->aVar = allocSpace(p->aVar, nVar*sizeof(Mem), &zCsr, zEnd, &nByte);
    p->apArg = allocSpace(p->apArg, nArg*sizeof(Mem*), &zCsr, zEnd, &nByte);
    p->azVar = allocSpace(p->azVar, nVar*sizeof(char*), &zCsr, zEnd, &nByte);
    p->apCsr = allocSpace(p->apCsr, nCursor*sizeof(VdbeCursor*),
                          &zCsr, zEnd, &nByte);
    p->aOnceFlag = allocSpace(p->aOnceFlag, nOnce, &zCsr, zEnd, &nByte);
    if( nByte ){
      p->pFree = sqlite3DbMallocZero(db, nByte);
    }
    zCsr = p->pFree;
    zEnd = &zCsr[nByte];
  }while( nByte && !db->mallocFailed );

  p->nCursor = nCursor;
  p->nOnceFlag = nOnce;
  if( p->aVar ){
    p->nVar = (ynVar)nVar;
    for(n=0; n<nVar; n++){
      p->aVar[n].flags = MEM_Null;
      p->aVar[n].db = db;
    }
  }
  if( p->azVar ){
    p->nzVar = pParse->nzVar;
    memcpy(p->azVar, pParse->azVar, p->nzVar*sizeof(p->azVar[0]));
    memset(pParse->azVar, 0, pParse->nzVar*sizeof(pParse->azVar[0]));
  }
  if( p->aMem ){
    p->aMem--;                      /* aMem[] goes from 1..nMem */
    p->nMem = nMem;                 /*       not from 0..nMem-1 */
    for(n=1; n<=nMem; n++){
      p->aMem[n].flags = MEM_Invalid;
      p->aMem[n].db = db;
    }
  }
  p->explain = pParse->explain;
  sqlite3VdbeRewind(p);
}